

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

float __thiscall Assimp::CFIReaderImpl::getAttributeValueAsFloat(CFIReaderImpl *this,char *name)

{
  int iVar1;
  Attribute *pAVar2;
  undefined4 extraout_var;
  ai_real aVar3;
  shared_ptr<const_Assimp::FIFloatValue> floatValue;
  shared_ptr<const_Assimp::FIValue> local_20;
  
  pAVar2 = getAttributeByName(this,name);
  if (pAVar2 == (Attribute *)0x0) {
    aVar3 = 0.0;
  }
  else {
    std::dynamic_pointer_cast<Assimp::FIFloatValue_const,Assimp::FIValue_const>(&local_20);
    if (local_20.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      iVar1 = (**((pAVar2->value).
                  super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 _vptr_FIValue)();
      aVar3 = fast_atof(*(char **)CONCAT44(extraout_var,iVar1));
    }
    else {
      aVar3 = 0.0;
      if ((long)local_20.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr[2]._vptr_FIValue -
          (long)local_20.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr[1]._vptr_FIValue == 4) {
        aVar3 = *(ai_real *)
                 local_20.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr[1]._vptr_FIValue;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_20.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return aVar3;
}

Assistant:

virtual float getAttributeValueAsFloat(const char* name) const /*override*/ {
        const Attribute* attr = getAttributeByName(name);
        if (!attr) {
            return 0;
        }
        std::shared_ptr<const FIFloatValue> floatValue = std::dynamic_pointer_cast<const FIFloatValue>(attr->value);
        if (floatValue) {
            return floatValue->value.size() == 1 ? floatValue->value.front() : 0;
        }

        return fast_atof(attr->value->toString().c_str());
    }